

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_bubble_sort(int **dst,size_t size)

{
  int *piVar1;
  int *_sort_swap_temp;
  size_t newn;
  size_t i;
  size_t n;
  size_t size_local;
  int **dst_local;
  
  n = size;
  while (n != 0) {
    newn = 0;
    for (i = 1; i < n; i = i + 1) {
      if (0 < *dst[i - 1] - *dst[i]) {
        piVar1 = dst[i - 1];
        dst[i - 1] = dst[i];
        dst[i] = piVar1;
        newn = i;
      }
    }
    n = newn;
  }
  return;
}

Assistant:

void BUBBLE_SORT(SORT_TYPE *dst, const size_t size) {
  size_t n = size;

  while (n) {
    size_t i, newn = 0U;

    for (i = 1U; i < n; ++i) {
      if (SORT_CMP(dst[i - 1U], dst[i]) > 0) {
        SORT_SWAP(dst[i - 1U], dst[i]);
        newn = i;
      }
    }

    n = newn;
  }
}